

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall JsonNumber_BadFractionDigit_Test::TestBody(JsonNumber_BadFractionDigit_Test *this)

{
  bool bVar1;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_00;
  error_code *lhs;
  char *message;
  error_code eVar2;
  AssertHelper local_118;
  Message local_110;
  error_code local_108;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  mock_json_callbacks *local_b8;
  undefined1 local_b0 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  JsonNumber_BadFractionDigit_Test *this_local;
  
  local_b8 = (this->super_JsonNumber).proxy_.original_;
  p.coordinate_ = (coord)this;
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0,
             (callbacks_proxy<mock_json_callbacks>)local_b8,none);
  s_abi_cxx11_(&local_d8,"1..",3);
  this_00 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0,&local_d8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_00);
  std::__cxx11::string::~string((string *)&local_d8);
  lhs = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                  ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  eVar2 = pstore::json::make_error_code(unrecognized_token);
  local_108._M_cat = eVar2._M_cat;
  local_108._M_value = eVar2._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_f8,"p.last_error ()",
             "make_error_code (json::error_code::unrecognized_token)",lhs,&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0x10d,message);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b0);
  return;
}

Assistant:

TEST_F (JsonNumber, BadFractionDigit) {
    json::parser<decltype (proxy_)> p (proxy_);
    p.input ("1.."s).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unrecognized_token));
}